

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O2

void __thiscall CodeEmitter::emitValue(CodeEmitter *this,AstNode *valueNode,Word word)

{
  Type TVar1;
  AstNode *pAVar2;
  undefined8 extraout_RAX;
  Word word_00;
  CodeEmitter *pCVar3;
  AstNode referenceNode;
  AstNode referenceNode_1;
  string sStack_178;
  string local_158;
  undefined1 local_138 [56];
  AstNode *local_100;
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  string local_88;
  undefined1 local_68 [80];
  
  TVar1 = valueNode->type;
  if (TVar1 == NumberNode) {
    emitWord(this,(Word)(word.data & 0xcfffU | (int)valueNode->aValue << 0x10));
    return;
  }
  if (TVar1 != ParenNode) {
    if (TVar1 == ReferenceNode) {
      std::__cxx11::string::string((string *)(local_a8 + 0x20),(string *)&valueNode->sValue);
      markReference(this,(string *)(local_a8 + 0x20));
      word_00.data = word.data & 0xcfffU | 0xffff0000;
      std::__cxx11::string::~string((string *)(local_a8 + 0x20));
      goto LAB_0010d06d;
    }
    pCVar3 = (CodeEmitter *)local_e8;
    std::__cxx11::string::string
              ((string *)pCVar3,"wrong instruction argument",(allocator *)local_138);
    emitterError(pCVar3,(string *)local_e8);
LAB_0010d0aa:
    pCVar3 = (CodeEmitter *)local_c8;
    std::__cxx11::string::string((string *)pCVar3,"wrong paren content",(allocator *)local_138);
    emitterError(pCVar3,(string *)local_c8);
LAB_0010d0d0:
    pCVar3 = (CodeEmitter *)local_a8;
    std::__cxx11::string::string((string *)pCVar3,"wrong paren content",(allocator *)local_68);
    emitterError(pCVar3,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    AstNode::~AstNode((AstNode *)local_138);
    _Unwind_Resume(extraout_RAX);
  }
  pAVar2 = (valueNode->children).super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pAVar2->type == ParenNode) {
    AstNode::AstNode((AstNode *)local_138,pAVar2);
    if (local_100->type != ReferenceNode) goto LAB_0010d0d0;
    AstNode::AstNode((AstNode *)local_68,local_100);
    std::__cxx11::string::string((string *)&sStack_178,(string *)(local_68 + 0x18));
    markReference(this,&sStack_178);
    word_00.data = word.data & 0xffffcfffU | 0xffff2000;
    std::__cxx11::string::~string((string *)&sStack_178);
    AstNode::~AstNode((AstNode *)local_68);
  }
  else {
    if (pAVar2->type != ReferenceNode) goto LAB_0010d0aa;
    AstNode::AstNode((AstNode *)local_138,pAVar2);
    std::__cxx11::string::string((string *)&local_158,(string *)(local_138 + 0x18));
    markReference(this,&local_158);
    word_00.data = word.data & 0xffffcfffU | 0xffff1000;
    std::__cxx11::string::~string((string *)&local_158);
  }
  AstNode::~AstNode((AstNode *)local_138);
LAB_0010d06d:
  emitWord(this,word_00);
  return;
}

Assistant:

void CodeEmitter::emitValue(AstNode valueNode, Word word) {
    if(valueNode.type == AstNode::ReferenceNode) {
        word.instruction.mod = 0;
        word.instruction.adr = -1;
        markReference(valueNode.sValue);
        emitWord(word);
    } else if(valueNode.type == AstNode::ParenNode) {
        word.instruction.adr = -1;

        if(valueNode.children.front().type == AstNode::ReferenceNode) {
            AstNode referenceNode = valueNode.children.front();
            word.instruction.mod = 1;
            markReference(referenceNode.sValue);
        } else if(valueNode.children.front().type == AstNode::ParenNode) {
            AstNode secondParenNode = valueNode.children.front();
            if(secondParenNode.children.front().type == AstNode::ReferenceNode) {
                AstNode referenceNode = secondParenNode.children.front();
                word.instruction.mod = 2;
                markReference(referenceNode.sValue);
            } else {
                emitterError("wrong paren content");
            }
        } else {
            emitterError("wrong paren content");
        }

        emitWord(word);
    } else if(valueNode.type == AstNode::NumberNode) {
        word.instruction.mod = 0;
        word.instruction.adr = valueNode.aValue;
        emitWord(word);
    } else {
        emitterError("wrong instruction argument");
    }
}